

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

double absl::base_internal::MeasureTscFrequency(void)

{
  double dVar1;
  double measurement;
  int i;
  int sleep_nanoseconds;
  double last_measurement;
  
  _i = -1.0;
  measurement._4_4_ = 1000000;
  measurement._0_4_ = 0;
  while( true ) {
    if (7 < measurement._0_4_) {
      return _i;
    }
    dVar1 = MeasureTscFrequencyWithSleep(measurement._4_4_);
    if ((dVar1 * 0.99 < _i) && (_i < dVar1 * 1.01)) break;
    measurement._4_4_ = measurement._4_4_ << 1;
    measurement._0_4_ = measurement._0_4_ + 1;
    _i = dVar1;
  }
  return dVar1;
}

Assistant:

static double MeasureTscFrequency() {
  double last_measurement = -1.0;
  int sleep_nanoseconds = 1000000;  // 1 millisecond.
  for (int i = 0; i < 8; ++i) {
    double measurement = MeasureTscFrequencyWithSleep(sleep_nanoseconds);
    if (measurement * 0.99 < last_measurement &&
        last_measurement < measurement * 1.01) {
      // Use the current measurement if it is within 1% of the
      // previous measurement.
      return measurement;
    }
    last_measurement = measurement;
    sleep_nanoseconds *= 2;
  }
  return last_measurement;
}